

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

void PredictorSub11_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  
  uVar23 = 0;
  if (3 < num_pixels) {
    uVar22 = 0;
    do {
      auVar38 = *(undefined1 (*) [16])(in + (uVar22 - 1));
      puVar1 = in + uVar22;
      cVar5 = *(char *)((long)puVar1 + 1);
      cVar6 = *(char *)((long)puVar1 + 2);
      cVar7 = *(char *)((long)puVar1 + 3);
      uVar17 = puVar1[1];
      cVar8 = *(char *)((long)puVar1 + 5);
      cVar9 = *(char *)((long)puVar1 + 6);
      cVar10 = *(char *)((long)puVar1 + 7);
      uVar18 = puVar1[2];
      cVar11 = *(char *)((long)puVar1 + 9);
      cVar12 = *(char *)((long)puVar1 + 10);
      cVar13 = *(char *)((long)puVar1 + 0xb);
      uVar19 = puVar1[3];
      cVar14 = *(char *)((long)puVar1 + 0xd);
      cVar15 = *(char *)((long)puVar1 + 0xe);
      cVar16 = *(char *)((long)puVar1 + 0xf);
      auVar29 = *(undefined1 (*) [16])(upper + (uVar22 - 1));
      auVar3 = *(undefined1 (*) [16])(upper + uVar22);
      uVar24 = auVar3._0_4_;
      uVar25 = auVar3._4_4_;
      uVar26 = auVar3._8_4_;
      uVar27 = auVar3._12_4_;
      auVar31._0_8_ = auVar29._0_8_;
      auVar31._8_4_ = auVar29._4_4_;
      auVar31._12_4_ = uVar25;
      auVar30._8_8_ = auVar31._8_8_;
      auVar30._0_4_ = auVar29._0_4_;
      auVar30._4_4_ = uVar24;
      auVar32._4_4_ = uVar24;
      auVar32._0_4_ = uVar24;
      auVar32._8_4_ = uVar25;
      auVar32._12_4_ = uVar25;
      auVar32 = psadbw(auVar30,auVar32);
      auVar33._4_4_ = uVar26;
      auVar33._0_4_ = auVar29._8_4_;
      auVar33._8_4_ = auVar29._12_4_;
      auVar33._12_4_ = uVar27;
      auVar34._4_4_ = uVar26;
      auVar34._0_4_ = uVar26;
      auVar34._8_4_ = uVar27;
      auVar34._12_4_ = uVar27;
      auVar34 = psadbw(auVar33,auVar34);
      auVar32 = packssdw(auVar32,auVar34);
      uVar24 = auVar38._0_4_;
      uVar25 = auVar38._4_4_;
      uVar26 = auVar38._8_4_;
      uVar27 = auVar38._12_4_;
      auVar36._8_4_ = auVar29._4_4_;
      auVar36._0_8_ = auVar31._0_8_;
      auVar36._12_4_ = uVar25;
      auVar35._8_8_ = auVar36._8_8_;
      auVar35._4_4_ = uVar24;
      auVar35._0_4_ = auVar30._0_4_;
      auVar4._4_4_ = uVar24;
      auVar4._0_4_ = uVar24;
      auVar4._8_4_ = uVar25;
      auVar4._12_4_ = uVar25;
      auVar34 = psadbw(auVar35,auVar4);
      auVar28._4_4_ = uVar26;
      auVar28._0_4_ = auVar29._8_4_;
      auVar28._8_4_ = auVar29._12_4_;
      auVar28._12_4_ = uVar27;
      auVar29._4_4_ = uVar26;
      auVar29._0_4_ = uVar26;
      auVar29._8_4_ = uVar27;
      auVar29._12_4_ = uVar27;
      auVar29 = psadbw(auVar28,auVar29);
      auVar29 = packssdw(auVar34,auVar29);
      auVar37._0_4_ = -(uint)(auVar32._0_4_ < auVar29._0_4_);
      auVar37._4_4_ = -(uint)(auVar32._4_4_ < auVar29._4_4_);
      auVar37._8_4_ = -(uint)(auVar32._8_4_ < auVar29._8_4_);
      auVar37._12_4_ = -(uint)(auVar32._12_4_ < auVar29._12_4_);
      auVar38 = ~auVar37 & auVar3 | auVar38 & auVar37;
      puVar2 = out + uVar22;
      *(char *)puVar2 = (char)*puVar1 - auVar38[0];
      *(char *)((long)puVar2 + 1) = cVar5 - auVar38[1];
      *(char *)((long)puVar2 + 2) = cVar6 - auVar38[2];
      *(char *)((long)puVar2 + 3) = cVar7 - auVar38[3];
      *(char *)(puVar2 + 1) = (char)uVar17 - auVar38[4];
      *(char *)((long)puVar2 + 5) = cVar8 - auVar38[5];
      *(char *)((long)puVar2 + 6) = cVar9 - auVar38[6];
      *(char *)((long)puVar2 + 7) = cVar10 - auVar38[7];
      *(char *)(puVar2 + 2) = (char)uVar18 - auVar38[8];
      *(char *)((long)puVar2 + 9) = cVar11 - auVar38[9];
      *(char *)((long)puVar2 + 10) = cVar12 - auVar38[10];
      *(char *)((long)puVar2 + 0xb) = cVar13 - auVar38[0xb];
      *(char *)(puVar2 + 3) = (char)uVar19 - auVar38[0xc];
      *(char *)((long)puVar2 + 0xd) = cVar14 - auVar38[0xd];
      *(char *)((long)puVar2 + 0xe) = cVar15 - auVar38[0xe];
      *(char *)((long)puVar2 + 0xf) = cVar16 - auVar38[0xf];
      uVar23 = uVar22 + 4;
      uVar21 = uVar22 + 8;
      uVar22 = uVar23;
    } while (uVar21 <= (uint)num_pixels);
  }
  iVar20 = num_pixels - (int)uVar23;
  if (iVar20 == 0) {
    return;
  }
  uVar23 = uVar23 & 0xffffffff;
  (*VP8LPredictorsSub_C[0xb])(in + uVar23,upper + uVar23,iVar20,out + uVar23);
  return;
}

Assistant:

static void PredictorSub11_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i pa, pb;
    GetSumAbsDiff32_SSE2(&T, &TL, &pa);   // pa = sum |T-TL|
    GetSumAbsDiff32_SSE2(&L, &TL, &pb);   // pb = sum |L-TL|
    {
      const __m128i mask = _mm_cmpgt_epi32(pb, pa);
      const __m128i A = _mm_and_si128(mask, L);
      const __m128i B = _mm_andnot_si128(mask, T);
      const __m128i pred = _mm_or_si128(A, B);    // pred = (L > T)? L : T
      const __m128i res = _mm_sub_epi8(src, pred);
      _mm_storeu_si128((__m128i*)&out[i], res);
    }
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[11](in + i, upper + i, num_pixels - i, out + i);
  }
}